

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscachebackend.cpp
# Opt level: O2

int __thiscall
QNetworkAccessCacheBackend::open(QNetworkAccessCacheBackend *this,char *__file,int __oflag,...)

{
  bool bVar1;
  Operation OVar2;
  long in_FS_OFFSET;
  QNetworkAccessBackend local_90 [8];
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  OVar2 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
  if (OVar2 == GetOperation) {
    bVar1 = sendCacheContents(this);
    if (bVar1) {
      QVariant::QVariant((QVariant *)&local_58,true);
      QNetworkAccessBackend::setAttribute
                ((QNetworkAccessBackend *)this,SourceIsFromCacheAttribute,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_00175d8a;
    }
  }
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QCoreApplication::translate((char *)&local_70,"QNetworkAccessCacheBackend","Error opening %1",0);
  QNetworkAccessBackend::url(local_90);
  QUrl::toString(&local_88,local_90,0);
  QString::arg<QString,_true>
            ((QString *)&local_58,(QString *)&local_70,(QString *)&local_88,0,(QChar)0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QUrl::~QUrl((QUrl *)local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QNetworkAccessBackend::error
            ((QNetworkAccessBackend *)this,ContentNotFoundError,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
LAB_00175d8a:
  QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessCacheBackend::open()
{
    if (operation() != QNetworkAccessManager::GetOperation || !sendCacheContents()) {
        QString msg = QCoreApplication::translate("QNetworkAccessCacheBackend", "Error opening %1")
                                                .arg(this->url().toString());
        error(QNetworkReply::ContentNotFoundError, msg);
    } else {
        setAttribute(QNetworkRequest::SourceIsFromCacheAttribute, true);
    }
    finished();
}